

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastToUUID::Operation<duckdb::string_t,duckdb::hugeint_t>
          (TryCastToUUID *this,string_t input,hugeint_t *result,Vector *result_vector,
          CastParameters *parameters)

{
  bool bVar1;
  string sStack_48;
  anon_union_16_2_67f50693_for_value local_28;
  
  local_28.pointer.ptr = (char *)input.value._0_8_;
  local_28._0_8_ = this;
  string_t::GetString_abi_cxx11_(&sStack_48,(string_t *)&local_28.pointer);
  bVar1 = BaseUUID::FromString(&sStack_48,input.value._8_8_,(bool)(result_vector->type).id_);
  ::std::__cxx11::string::~string((string *)&sStack_48);
  return bVar1;
}

Assistant:

bool TryCastToUUID::Operation(string_t input, hugeint_t &result, Vector &result_vector, CastParameters &parameters) {
	return UUID::FromString(input.GetString(), result, parameters.strict);
}